

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall Js::ByteCodeBufferReader::GetString16LengthById(ByteCodeBufferReader *this,int id)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LPCWSTR pWVar4;
  LPCWSTR pWVar5;
  long lVar6;
  
  if ((id < this->expectedBuildInPropertyCount) ||
     (this->expectedBuildInPropertyCount + this->string16Count < id)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0xbe1,"(false)","false");
    if (!bVar2) goto LAB_0087ae38;
    *puVar3 = 0;
  }
  pWVar4 = GetString16ById(this,id,(bool *)0x0);
  pWVar5 = GetString16ById(this,id + 1,(bool *)0x0);
  lVar6 = (long)pWVar5 - (long)pWVar4 >> 1;
  if (0x100000000 < lVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0xbe6,"(result <= 0xffffffff)","result <= UINT_MAX");
    if (!bVar2) {
LAB_0087ae38:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (int)lVar6 - 1;
}

Assistant:

uint32 GetString16LengthById(int id)
    {
        if(!(id >= this->expectedBuildInPropertyCount && id<=string16Count + this->expectedBuildInPropertyCount))
        {
            Assert(false);
        }
        LPCWSTR s1 = GetString16ById(id);
        LPCWSTR s2 = GetString16ById(id + 1);
        auto result = s2 - s1 - 1;
        Assert(result <= UINT_MAX);
        return (uint32)result;
    }